

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

idx_t duckdb::StrfTimeFormat::GetSpecifierLength
                (StrTimeSpecifier specifier,date_t date,int32_t *data,char *tz_name)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  uint32_t value;
  int32_t iVar4;
  int iVar5;
  size_t sVar6;
  idx_t iVar7;
  InternalException *pIVar8;
  undefined7 in_register_00000039;
  bool bVar9;
  bool bVar10;
  date_t in_stack_ffffffffffffffc4;
  string local_38;
  
  switch((int)CONCAT71(in_register_00000039,specifier)) {
  case 1:
    iVar4 = Date::ExtractISODayOfTheWeek(date);
    iVar7 = (ulong)*(uint *)(Date::DAY_NAMES + (long)(iVar4 % 7) * 0x10);
    break;
  default:
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented specifier for GetSpecifierLength",
               (allocator *)&stack0xffffffffffffffc7);
    InternalException::InternalException(pIVar8,&local_38);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    value = data[2];
    goto LAB_0155831f;
  case 6:
    iVar7 = (ulong)*(uint *)(Date::MONTH_NAMES_ABBREVIATED + (long)data[1] * 0x10 + 0xb0);
    break;
  case 8:
    bVar10 = SBORROW4(data[1],10);
    bVar9 = data[1] + -10 < 0;
    goto LAB_01558336;
  case 10:
    uVar1 = *data;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    value = uVar2 % 100;
    goto LAB_0155831f;
  case 0xb:
    if ((uint)*data < 10000) {
      return 4;
    }
    iVar5 = NumericHelper::SignedLength<int,unsigned_int>(*data);
    goto LAB_01558324;
  case 0xd:
  case 0xf:
  case 0x12:
  case 0x14:
    if (7 < specifier - 0xd) {
switchD_0155824d_caseD_e:
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Time specifier mismatch",(allocator *)&stack0xffffffffffffffc7
                );
      InternalException::InternalException(pIVar8,&local_38);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar5 = data[3];
    switch((uint)specifier) {
    case 0xd:
      bVar10 = SBORROW4(iVar5,10);
      bVar9 = iVar5 + -10 < 0;
      break;
    default:
      goto switchD_0155824d_caseD_e;
    case 0xf:
      bVar9 = 9 < iVar5 % 0xc || iVar5 % 0xc == 0;
      goto LAB_01558339;
    case 0x12:
      bVar10 = SBORROW4(data[4],10);
      bVar9 = data[4] + -10 < 0;
      break;
    case 0x14:
      bVar10 = SBORROW4(data[5],10);
      bVar9 = data[5] + -10 < 0;
    }
LAB_01558336:
    bVar9 = bVar10 == bVar9;
LAB_01558339:
    iVar7 = (ulong)bVar9 + 1;
    break;
  case 0x17:
    sVar3 = (short)((long)data[7] % 0xe10);
    iVar7 = 9;
    if (sVar3 % 0x3c == 0) {
      iVar7 = (ulong)(0x76 < (ushort)(sVar3 + 0x3bU)) * 3 + 3;
    }
    break;
  case 0x18:
    if (tz_name != (char *)0x0) {
      sVar6 = strlen(tz_name);
      return sVar6;
    }
    iVar7 = 0;
    break;
  case 0x1a:
    value = Date::ExtractDayOfTheYear(in_stack_ffffffffffffffc4);
LAB_0155831f:
    iVar5 = NumericHelper::UnsignedLength<unsigned_int>(value);
LAB_01558324:
    iVar7 = (long)iVar5;
  }
  return iVar7;
}

Assistant:

idx_t StrfTimeFormat::GetSpecifierLength(StrTimeSpecifier specifier, date_t date, int32_t data[8],
                                         const char *tz_name) {
	switch (specifier) {
	case StrTimeSpecifier::FULL_WEEKDAY_NAME:
		return Date::DAY_NAMES[Date::ExtractISODayOfTheWeek(date) % 7].GetSize();
	case StrTimeSpecifier::FULL_MONTH_NAME:
		return Date::MONTH_NAMES[data[1] - 1].GetSize();
	case StrTimeSpecifier::YEAR_DECIMAL: {
		auto year = data[0];
		// Be consistent with WriteStandardSpecifier
		if (0 <= year && year <= 9999) {
			return 4;
		} else {
			return UnsafeNumericCast<idx_t>(NumericHelper::SignedLength<int32_t, uint32_t>(year));
		}
	}
	case StrTimeSpecifier::MONTH_DECIMAL: {
		idx_t len = 1;
		auto month = data[1];
		len += month >= 10;
		return len;
	}
	case StrTimeSpecifier::UTC_OFFSET: {
		// ±HH or ±HH:MM or ±HH:MM:SS
		int hh, mm, ss;
		StrfTimeSplitOffset(data[7], hh, mm, ss);
		return ss ? 9 : (mm ? 6 : 3);
	}
	case StrTimeSpecifier::TZ_NAME:
		if (tz_name) {
			return strlen(tz_name);
		}
		// empty for now
		return 0;
	case StrTimeSpecifier::HOUR_24_DECIMAL:
	case StrTimeSpecifier::HOUR_12_DECIMAL:
	case StrTimeSpecifier::MINUTE_DECIMAL:
	case StrTimeSpecifier::SECOND_DECIMAL: {
		// time specifiers
		idx_t len = 1;
		int32_t hour = data[3], min = data[4], sec = data[5];
		switch (specifier) {
		case StrTimeSpecifier::HOUR_24_DECIMAL:
			len += hour >= 10;
			break;
		case StrTimeSpecifier::HOUR_12_DECIMAL:
			hour = hour % 12;
			if (hour == 0) {
				hour = 12;
			}
			len += hour >= 10;
			break;
		case StrTimeSpecifier::MINUTE_DECIMAL:
			len += min >= 10;
			break;
		case StrTimeSpecifier::SECOND_DECIMAL:
			len += sec >= 10;
			break;
		default:
			throw InternalException("Time specifier mismatch");
		}
		return len;
	}
	case StrTimeSpecifier::DAY_OF_MONTH:
		return UnsafeNumericCast<idx_t>(NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(data[2])));
	case StrTimeSpecifier::DAY_OF_YEAR_DECIMAL:
		return UnsafeNumericCast<idx_t>(
		    NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(Date::ExtractDayOfTheYear(date))));
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY:
		return UnsafeNumericCast<idx_t>(
		    NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(AbsValue(data[0]) % 100)));
	default:
		throw InternalException("Unimplemented specifier for GetSpecifierLength");
	}
}